

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfactoryloader.cpp
# Opt level: O1

QList<QCborArray> * __thiscall
QFactoryLoader::metaDataKeys(QList<QCborArray> *__return_storage_ptr__,QFactoryLoader *this)

{
  QMutex *this_00;
  __pointer_type copy;
  pointer puVar1;
  qsizetype qVar2;
  long lVar3;
  byte *pbVar4;
  bool bVar5;
  QCborError QVar6;
  int iVar7;
  pointer puVar8;
  int iVar9;
  ulong uVar10;
  undefined1 *puVar11;
  long in_FS_OFFSET;
  bool bVar12;
  QLatin1StringView key;
  QCborContainerPrivate *local_f8;
  QByteArray local_c8;
  undefined1 local_a8 [16];
  undefined1 *local_98;
  QCborArray QStack_90;
  undefined1 local_88 [24];
  char *local_70 [3];
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QCborArray *)0x0;
  (__return_storage_ptr__->d).size = 0;
  this_00 = &(this->d).mutex;
  if ((this->d).mutex.super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar12 = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar12) {
      (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar12) goto LAB_002d8b91;
  }
  QBasicMutex::lockInternal(&this_00->super_QBasicMutex);
LAB_002d8b91:
  puVar8 = (this->d).libraries.
           super__Vector_base<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->d).libraries.
           super__Vector_base<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar8 != puVar1) {
    do {
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QCborValue::operator[]
                ((QCborValue *)local_a8,
                 (QCborValue *)
                 &((puVar8->_M_t).super___uniq_ptr_impl<QLibraryPrivate,_QLibraryPrivate::Deleter>.
                   _M_t.super__Tuple_impl<0UL,_QLibraryPrivate_*,_QLibraryPrivate::Deleter>.
                   super__Head_base<0UL,_QLibraryPrivate_*,_false>._M_head_impl)->metaData,4);
      key.m_data = "Keys";
      key.m_size = 4;
      QCborValue::operator[]((QCborValue *)local_58,(QCborValue *)local_a8,key);
      QCborValue::toArray((QCborValue *)local_70);
      QtPrivate::QMovableArrayOps<QCborArray>::emplace<QCborArray>
                ((QMovableArrayOps<QCborArray> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,(QCborArray *)local_70);
      QList<QCborArray>::end(__return_storage_ptr__);
      QCborArray::~QCborArray((QCborArray *)local_70);
      QCborValue::~QCborValue((QCborValue *)local_58);
      QCborValue::~QCborValue((QCborValue *)local_a8);
      puVar8 = puVar8 + 1;
    } while (puVar8 != puVar1);
  }
  local_f8 = (QCborContainerPrivate *)(this->d).iid.d.ptr;
  if (local_f8 == (QCborContainerPrivate *)0x0) {
    local_f8 = (QCborContainerPrivate *)0x4e8460;
  }
  qVar2 = (this->d).iid.d.size;
  QPluginLoader::staticPlugins();
  puVar11 = &DAT_aaaaaaaaaaaaaaaa;
  do {
    lVar3 = *(long *)(puVar11 + 8);
    pbVar4 = *(byte **)(puVar11 + 0x10);
    QStack_90.d.d.ptr = (QExplicitlySharedDataPointer<QCborContainerPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    local_a8._8_8_ = local_f8;
    local_98 = (undefined1 *)0xaaaaaaaaaaaaaa00;
    local_a8._0_8_ = qVar2;
    QCborArray::QCborArray(&QStack_90);
    if ((*pbVar4 & 0xfe) == 0) {
      local_c8.d.ptr = (char *)(pbVar4 + 4);
      local_c8.d.size = lVar3 + -4;
      local_c8.d.d = (Data *)0x0;
      local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QCborStreamReader::QCborStreamReader((QCborStreamReader *)local_88,&local_c8);
      if (local_88[0x10] == 0xa0) {
        bVar12 = QCborStreamReader::_enterContainer_helper((QCborStreamReader *)local_88);
        if (!bVar12) goto LAB_002d9076;
        while (local_88[0x10] != 0xff) {
          if (local_88[0x10] < 0x21) {
            uVar10 = -(ulong)(local_88[0x10] == 0x20) ^ local_88._0_8_;
            iVar9 = (int)uVar10;
            iVar7 = -0x55555556;
            if ((long)iVar9 == uVar10) {
              bVar12 = QCborStreamReader::next((QCborStreamReader *)local_88,10000);
              if (!bVar12) {
                QCborStreamReader::lastError((QCborStreamReader *)local_88);
                goto LAB_002d8eb1;
              }
              if (iVar9 == 4) {
                bVar12 = true;
                if (local_98._0_1_ == true) {
                  iVar7 = -4;
                  if ((local_88[0x10] == 0xa0) &&
                     (bVar5 = QCborStreamReader::isLengthKnown((QCborStreamReader *)local_88), bVar5
                     )) {
                    bVar5 = QCborStreamReader::_enterContainer_helper((QCborStreamReader *)local_88)
                    ;
                    if (bVar5) {
                      do {
                        if (local_88[0x10] == 0xff) goto LAB_002d902e;
                        local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                        local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                        local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                        QCborStreamReader::readAllUtf8String
                                  ((QByteArray *)local_58,(QCborStreamReader *)local_88);
                        local_70[0] = "Keys";
                        bVar5 = ::operator==((QByteArray *)local_58,local_70);
                        bVar5 = !bVar5;
                        if (bVar5) {
                          QCborStreamReader::next((QCborStreamReader *)local_88,10000);
                        }
                        if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
                          LOCK();
                          (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>.
                          _M_i = (((QBasicAtomicInt *)local_58._0_8_)->_q_value).
                                 super___atomic_base<int>._M_i + -1;
                          UNLOCK();
                          if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).
                              super___atomic_base<int>._M_i == 0) {
                            QArrayData::deallocate((QArrayData *)local_58._0_8_,1,0x10);
                          }
                        }
                      } while (bVar5);
                      if (bVar5) {
LAB_002d902e:
                        iVar7 = 0;
                      }
                    }
                    else {
                      iVar7 = -1;
                    }
                  }
                }
                else {
                  iVar7 = 0;
                }
              }
              else {
                if (iVar9 == 2) {
                  anon_unknown.dwarf_9bac16::QFactoryLoaderIidSearch::operator()
                            ((QFactoryLoaderIidSearch *)local_a8,IID,(QCborStreamReader *)local_88);
                }
                else {
                  QCborStreamReader::next((QCborStreamReader *)local_88,10000);
                }
                bVar12 = true;
                iVar7 = 1;
              }
            }
            else {
LAB_002d8eb1:
              bVar12 = false;
            }
            if (!bVar12) goto LAB_002d907e;
          }
          else {
            if (local_88[0x10] != 0x60) goto LAB_002d907e;
            local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            QCborStreamReader::readAllUtf8String
                      ((QByteArray *)local_58,(QCborStreamReader *)local_88);
            bVar12 = QByteArray::isNull((QByteArray *)local_58);
            if (bVar12) {
              iVar7 = -0x55555556;
              QCborStreamReader::lastError((QCborStreamReader *)local_88);
            }
            else {
              iVar7 = 1;
              QCborStreamReader::next((QCborStreamReader *)local_88,10000);
            }
            if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_58._0_8_,1,0x10);
              }
            }
            if (bVar12) goto LAB_002d907e;
          }
          QVar6 = QCborStreamReader::lastError((QCborStreamReader *)local_88);
          if ((iVar7 != 1) || (QVar6.c != NoError)) goto LAB_002d907e;
        }
        bVar12 = QCborStreamReader::leaveContainer((QCborStreamReader *)local_88);
        if (!bVar12) goto LAB_002d9076;
      }
      else if (local_88[0x10] == 0xff) {
LAB_002d9076:
        QCborStreamReader::lastError((QCborStreamReader *)local_88);
      }
LAB_002d907e:
      metaDataKeys();
    }
    if (local_98._0_1_ == true) {
      QtPrivate::QMovableArrayOps<QCborArray>::emplace<QCborArray>
                ((QMovableArrayOps<QCborArray> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,&QStack_90);
      QList<QCborArray>::end(__return_storage_ptr__);
    }
    QCborArray::~QCborArray(&QStack_90);
    puVar11 = puVar11 + 0x18;
    if (puVar11 == (undefined1 *)0xaaaaaaaaaaaaaa9a) {
      LOCK();
      _DAT_aaaaaaaaaaaaaaaa = _DAT_aaaaaaaaaaaaaaaa + -1;
      UNLOCK();
      if (_DAT_aaaaaaaaaaaaaaaa == 0) {
        QArrayData::deallocate((QArrayData *)&DAT_aaaaaaaaaaaaaaaa,0x18,0x10);
      }
      LOCK();
      copy = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
      (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      if (copy != (__pointer_type)0x1) {
        QBasicMutex::unlockInternalFutex(&this_00->super_QBasicMutex,copy);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

QList<QCborArray> QFactoryLoader::metaDataKeys() const
{
    QList<QCborArray> metaData;
#if QT_CONFIG(library)
    QMutexLocker locker(&d->mutex);
    for (const auto &library : d->libraries) {
        const QCborValue md = library->metaData.value(QtPluginMetaDataKeys::MetaData);
        metaData.append(md["Keys"_L1].toArray());
    }
#endif

    QLatin1StringView iid(d->iid.constData(), d->iid.size());
    const auto staticPlugins = QPluginLoader::staticPlugins();
    for (const QStaticPlugin &plugin : staticPlugins) {
        QByteArrayView pluginData(static_cast<const char *>(plugin.rawMetaData),
                                  plugin.rawMetaDataSize);
        QFactoryLoaderMetaDataKeysExtractor extractor{ iid };
        iterateInPluginMetaData(pluginData, extractor);
        if (extractor.matchesIid)
            metaData += std::move(extractor.keys);
    }

    // other portions of the code will cast to int (e.g., keyMap())
    Q_ASSERT(metaData.size() <= std::numeric_limits<int>::max());
    return metaData;
}